

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(FT_Vector *to,void *closure)

{
  FT_Pos FVar1;
  byte bVar2;
  
  bVar2 = 1;
  if (*(char *)((long)closure + 10) == '\x01') {
    bVar2 = (**(code **)(*closure + 0x28))(closure);
  }
  if (bVar2 != 0) {
    bVar2 = (**(code **)(*closure + 0x10))(closure,(int)(short)to->x,(int)(short)to->y);
  }
  FVar1 = to->y;
  *(FT_Pos *)((long)closure + 0x10) = to->x;
  *(FT_Pos *)((long)closure + 0x18) = FVar1;
  *(undefined1 *)((long)closure + 10) = 1;
  return (int)(bVar2 ^ 1);
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(const FT_Vector* to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTMoveto(to) ? 0 : 1;
}